

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
::push_back(vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
            *this,BilinearPatchMesh **value)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = this->nAlloc;
  sVar2 = this->nStored;
  if (sVar1 == sVar2) {
    sVar2 = 4;
    if (sVar1 != 0) {
      sVar2 = sVar1 * 2;
    }
    reserve(this,sVar2);
    sVar2 = this->nStored;
  }
  this->ptr[sVar2] = *value;
  this->nStored = sVar2 + 1;
  return;
}

Assistant:

void push_back(const T &value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, value);
        ++nStored;
    }